

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.h
# Opt level: O3

void __thiscall Debugger::MemoryWindow::MemoryWindow(MemoryWindow *this,Debugger *d)

{
  (this->super_Window).d = d;
  (this->super_Window).is_open = true;
  *(undefined4 *)&(this->super_Window).field_0xc = 0;
  (this->memory_editor).Open = true;
  (this->memory_editor).ReadOnly = false;
  (this->memory_editor).Cols = 0x10;
  (this->memory_editor).OptShowOptions = true;
  (this->memory_editor).OptShowDataPreview = false;
  (this->memory_editor).OptShowHexII = false;
  (this->memory_editor).OptShowAscii = true;
  (this->memory_editor).OptGreyOutZeroes = true;
  (this->memory_editor).OptUpperCaseHex = true;
  (this->memory_editor).OptMidColsCount = 8;
  (this->memory_editor).OptAddrDigitsCount = 0;
  (this->memory_editor).OptFooterExtraHeight = 0.0;
  (this->memory_editor).HighlightColor = 0x32ffffff;
  (this->memory_editor).ContentsWidthChanged = false;
  (this->memory_editor).HighlightFn = (_func_bool_ImU8_ptr_size_t_void_ptr *)0x0;
  *(undefined4 *)&(this->memory_editor).DataPreviewAddr = 0xffffffff;
  *(undefined4 *)((long)&(this->memory_editor).DataPreviewAddr + 4) = 0xffffffff;
  *(undefined4 *)&(this->memory_editor).DataEditingAddr = 0xffffffff;
  *(undefined4 *)((long)&(this->memory_editor).DataEditingAddr + 4) = 0xffffffff;
  (this->memory_editor).DataEditingTakeFocus = false;
  (this->memory_editor).DataInputBuf[0] = '\0';
  (this->memory_editor).DataInputBuf[1] = '\0';
  (this->memory_editor).DataInputBuf[2] = '\0';
  (this->memory_editor).DataInputBuf[3] = '\0';
  (this->memory_editor).DataInputBuf[4] = '\0';
  (this->memory_editor).DataInputBuf[5] = '\0';
  (this->memory_editor).DataInputBuf[6] = '\0';
  (this->memory_editor).DataInputBuf[7] = '\0';
  (this->memory_editor).DataInputBuf[8] = '\0';
  (this->memory_editor).DataInputBuf[9] = '\0';
  (this->memory_editor).DataInputBuf[10] = '\0';
  (this->memory_editor).DataInputBuf[0xb] = '\0';
  (this->memory_editor).DataInputBuf[0xc] = '\0';
  (this->memory_editor).DataInputBuf[0xd] = '\0';
  (this->memory_editor).DataInputBuf[0xe] = '\0';
  (this->memory_editor).DataInputBuf[0xf] = '\0';
  (this->memory_editor).DataInputBuf[0x10] = '\0';
  (this->memory_editor).DataInputBuf[0x11] = '\0';
  (this->memory_editor).DataInputBuf[0x12] = '\0';
  (this->memory_editor).DataInputBuf[0x13] = '\0';
  (this->memory_editor).DataInputBuf[0x14] = '\0';
  (this->memory_editor).DataInputBuf[0x15] = '\0';
  (this->memory_editor).DataInputBuf[0x16] = '\0';
  (this->memory_editor).DataInputBuf[0x17] = '\0';
  (this->memory_editor).DataInputBuf[0x18] = '\0';
  (this->memory_editor).DataInputBuf[0x19] = '\0';
  (this->memory_editor).DataInputBuf[0x1a] = '\0';
  (this->memory_editor).DataInputBuf[0x1b] = '\0';
  (this->memory_editor).DataInputBuf[0x1c] = '\0';
  (this->memory_editor).DataInputBuf[0x1d] = '\0';
  (this->memory_editor).DataInputBuf[0x1e] = '\0';
  *(undefined8 *)((this->memory_editor).DataInputBuf + 0x1f) = 0;
  (this->memory_editor).AddrInputBuf[7] = '\0';
  (this->memory_editor).AddrInputBuf[8] = '\0';
  (this->memory_editor).AddrInputBuf[9] = '\0';
  (this->memory_editor).AddrInputBuf[10] = '\0';
  (this->memory_editor).AddrInputBuf[0xb] = '\0';
  (this->memory_editor).AddrInputBuf[0xc] = '\0';
  (this->memory_editor).AddrInputBuf[0xd] = '\0';
  (this->memory_editor).AddrInputBuf[0xe] = '\0';
  (this->memory_editor).AddrInputBuf[0xf] = '\0';
  (this->memory_editor).AddrInputBuf[0x10] = '\0';
  (this->memory_editor).AddrInputBuf[0x11] = '\0';
  (this->memory_editor).AddrInputBuf[0x12] = '\0';
  (this->memory_editor).AddrInputBuf[0x13] = '\0';
  (this->memory_editor).AddrInputBuf[0x14] = '\0';
  (this->memory_editor).AddrInputBuf[0x15] = '\0';
  (this->memory_editor).AddrInputBuf[0x16] = '\0';
  (this->memory_editor).AddrInputBuf[0x17] = '\0';
  (this->memory_editor).AddrInputBuf[0x18] = '\0';
  (this->memory_editor).AddrInputBuf[0x19] = '\0';
  (this->memory_editor).AddrInputBuf[0x1a] = '\0';
  (this->memory_editor).AddrInputBuf[0x1b] = '\0';
  (this->memory_editor).AddrInputBuf[0x1c] = '\0';
  (this->memory_editor).AddrInputBuf[0x1d] = '\0';
  (this->memory_editor).AddrInputBuf[0x1e] = '\0';
  (this->memory_editor).AddrInputBuf[0x1f] = '\0';
  *(undefined4 *)&(this->memory_editor).GotoAddr = 0xffffffff;
  *(undefined4 *)((long)&(this->memory_editor).GotoAddr + 4) = 0xffffffff;
  *(undefined4 *)&(this->memory_editor).HighlightMin = 0xffffffff;
  *(undefined4 *)((long)&(this->memory_editor).HighlightMin + 4) = 0xffffffff;
  (this->memory_editor).HighlightMax = 0xffffffffffffffff;
  (this->memory_editor).PreviewEndianess = 0;
  (this->memory_editor).PreviewDataType = 4;
  this->memory_editor_base = 0;
  (this->memory_editor).FnUserData = this;
  (this->memory_editor).ReadFn = MemoryWindow::anon_class_1_0_00000001::__invoke;
  (this->memory_editor).WriteFn = MemoryWindow::anon_class_1_0_00000001::__invoke;
  return;
}

Assistant:

explicit Window(Debugger* d) : d(d) {}